

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void vfsUnlink(sqlite3_vfs *pVfs)

{
  bool bVar1;
  sqlite3_vfs *local_18;
  sqlite3_vfs *p;
  sqlite3_vfs *pVfs_local;
  
  if (pVfs != (sqlite3_vfs *)0x0) {
    if (vfsList == pVfs) {
      vfsList = pVfs->pNext;
    }
    else if (vfsList != (sqlite3_vfs *)0x0) {
      local_18 = vfsList;
      while( true ) {
        bVar1 = false;
        if (local_18->pNext != (sqlite3_vfs *)0x0) {
          bVar1 = local_18->pNext != pVfs;
        }
        if (!bVar1) break;
        local_18 = local_18->pNext;
      }
      if (local_18->pNext == pVfs) {
        local_18->pNext = pVfs->pNext;
      }
    }
  }
  return;
}

Assistant:

static void vfsUnlink(sqlite3_vfs *pVfs){
  assert( sqlite3_mutex_held(sqlite3MutexAlloc(SQLITE_MUTEX_STATIC_MASTER)) );
  if( pVfs==0 ){
    /* No-op */
  }else if( vfsList==pVfs ){
    vfsList = pVfs->pNext;
  }else if( vfsList ){
    sqlite3_vfs *p = vfsList;
    while( p->pNext && p->pNext!=pVfs ){
      p = p->pNext;
    }
    if( p->pNext==pVfs ){
      p->pNext = pVfs->pNext;
    }
  }
}